

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcexecutors.cpp
# Opt level: O2

int __thiscall
trun::TestFuncExecutorSequential::Execute
          (TestFuncExecutorSequential *this,TestFunc *testFunc,CBPrePostHook *cbPreHook,
          CBPrePostHook *cbPostHook)

{
  int iVar1;
  int iVar2;
  ILogger *this_00;
  long *in_FS_OFFSET;
  string exceptionString;
  Ref currentModule;
  allocator<char> local_58 [40];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&exceptionString,"TestFuncExeSeq",local_58);
  this_00 = gnilk::Logger::GetLogger(&exceptionString);
  std::__cxx11::string::~string((string *)&exceptionString);
  TestRunner::GetCurrentTestModule();
  if (currentModule.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    gnilk::Log::Error<char_const*>(this_00,"No module, can\'t execute!");
    iVar1 = -1;
  }
  else {
    if (cbPreHook->cbHookV1 != (TRUN_PRE_POST_HOOK_DELEGATE_V1 *)0x0) {
      testFunc->execState = PreCallback;
      iVar1 = TestFuncExecutorBase::InvokeHook(&this->super_TestFuncExecutorBase,cbPreHook);
      if (iVar1 != 0) goto LAB_0011bfb5;
    }
    testFunc->execState = Main;
    iVar2 = TestFunc::InvokeTestCase
                      (testFunc,&(currentModule.
                                  super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->testResponseProxy);
    *(undefined1 *)(*in_FS_OFFSET + -0x50) = 1;
    if (cbPostHook->cbHookV1 != (TRUN_PRE_POST_HOOK_DELEGATE_V1 *)0x0) {
      testFunc->execState = PostCallback;
      iVar1 = TestFuncExecutorBase::InvokeHook(&this->super_TestFuncExecutorBase,cbPostHook);
      if (iVar1 != 0) goto LAB_0011bfb5;
    }
    if (iVar2 == 0) {
      iVar1 = 0;
    }
    else {
      testFunc->execState = Main;
      iVar1 = iVar2;
    }
  }
LAB_0011bfb5:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&currentModule.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return iVar1;
}

Assistant:

int TestFuncExecutorSequential::Execute(TestFunc *testFunc, const CBPrePostHook &cbPreHook, const CBPrePostHook &cbPostHook) {
    // Begin test, note: THIS MUST BE DONE HERE - in case of threading!
    gnilk::ILogger  *pLogger = gnilk::Logger::GetLogger("TestFuncExeSeq");
    auto currentModule = TestRunner::GetCurrentTestModule();
    if (currentModule == nullptr) {
        pLogger->Error("No module, can't execute!");
        return -1;
    }

    auto &proxy = currentModule->GetTestResponseProxy();

    // Test-case pre function, note: cbPreHook is a union of funcptrs - doesn't matter which one I check against!
    if (cbPreHook.cbHookV1 != nullptr) {
        // Note: in case of threaded test execution, we this will terminate on error - we need to disable thread here OR we need to actually thread pre/post as well
        testFunc->ChangeExecState(TestFunc::kExecState::PreCallback);

        int preHookReturnCode = InvokeHook(cbPreHook);
        //preHookReturnCode = cbPreHook();
        if (preHookReturnCode != kTR_Pass) {
            //testReturnCode = preHookReturnCode;
            return preHookReturnCode;
        }
    }

    // Main (the actual test case)
    int testReturnCode = {};
    testFunc->ChangeExecState(TestFunc::kExecState::Main);

    // Trying 'cpptrace' to get a nice stack frame from an exception...
    // CPPTrace requires 'special' try/catch - there is some magic here
#ifdef TRUN_HAVE_EXCEPTIONS
    CPPTRACE_TRY {
        testReturnCode = testFunc->InvokeTestCase(proxy);
    } CPPTRACE_CATCH(...) {
        auto &exception_stacktrace = cpptrace::from_current_exception();

        // Ok, trying to print up to the test-runner code...
        // stop when the stack frame leaves the code under test
        int idxTargetFrame = 0;
        for(const auto& frame : exception_stacktrace.frames) {
            auto pathname = std::filesystem::path(frame.filename);
            if (pathname.filename() == "testfunc.h") {
                idxTargetFrame -= 1;
                break;
            }
            // FIXME: store this in conjunction with the result??
            cpptrace::print_frame(std::cout, true, 2, idxTargetFrame, frame);
            std::cout << "\n";
            idxTargetFrame++;
        }

        // Consider declaring an 'ExceptionError' in the Result class
        auto exceptionString = HandleException();
        auto &frame = exception_stacktrace.frames.at(idxTargetFrame);
        if (frame.line.has_value()) {
            printf("*** EXCEPTION ERROR: %s\t'%s'\n", frame.filename.c_str(), exceptionString.c_str());
        } else {
            printf("*** EXCEPTION ERROR: %s:%d\t'%s'\n",
                   frame.filename.c_str(), frame.line.value(),
                   exceptionString.c_str());
        }


        // Normally this would be printed in the Response Proxy
        // But exceptions are caught by the runner - thus, we print it here...
        proxy.SetExceptionError(exceptionString);
        testReturnCode = kTR_Fail;
    }
#else
    testReturnCode = testFunc->InvokeTestCase(proxy);
#endif
    // Test-case post function, note cbPostHook is a union of funcptrs - doesn't matter which one we check
    if (cbPostHook.cbHookV1 != nullptr) {
        testFunc->ChangeExecState(TestFunc::kExecState::PostCallback);
        int postHookReturnCode = InvokeHook(cbPostHook);
        //int postHookReturnCode = cbPostHook((ITestingV2 *)TestResponseProxy::GetTRTestInterface());
        if (postHookReturnCode != kTR_Pass) {
            return postHookReturnCode;
        }
    }

    // IF the thread is terminated - this won't matter - we will be in the correct state
    // However, IF post-hook is successful - but main function failed - we have changed the state and should change it back..
    if (testReturnCode != kTR_Pass) {
        testFunc->ChangeExecState(TestFunc::kExecState::Main);
    }

    return testReturnCode;
}